

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Initialize(ImGuiContext *context)

{
  int *piVar1;
  int iVar2;
  ImGuiSettingsHandler *pIVar3;
  ImGuiViewportP **ppIVar4;
  ImGuiID IVar5;
  ImGuiSettingsHandler *__dest;
  ImGuiViewportP *pIVar6;
  ImGuiViewportP **__dest_00;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [32];
  
  if ((context->Initialized == false) && (context->SettingsLoaded != true)) {
    IVar5 = ImHashStr("Window",0,0);
    iVar8 = (context->SettingsHandlers).Size;
    iVar2 = (context->SettingsHandlers).Capacity;
    if (iVar8 == iVar2) {
      iVar8 = iVar8 + 1;
      if (iVar2 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar2 / 2 + iVar2;
      }
      if (iVar8 < iVar7) {
        iVar8 = iVar7;
      }
      if (iVar2 < iVar8) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiSettingsHandler *)
                 (*GImAllocatorAllocFunc)((long)iVar8 * 0x48,GImAllocatorUserData);
        pIVar3 = (context->SettingsHandlers).Data;
        if (pIVar3 != (ImGuiSettingsHandler *)0x0) {
          memcpy(__dest,pIVar3,(long)(context->SettingsHandlers).Size * 0x48);
          pIVar3 = (context->SettingsHandlers).Data;
          if ((pIVar3 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
        }
        (context->SettingsHandlers).Data = __dest;
        (context->SettingsHandlers).Capacity = iVar8;
      }
    }
    pIVar3 = (context->SettingsHandlers).Data;
    iVar8 = (context->SettingsHandlers).Size;
    pIVar3[iVar8].TypeName = "Window";
    pIVar3[iVar8].TypeHash = IVar5;
    *(undefined4 *)&pIVar3[iVar8].field_0xc = 0;
    pIVar3[iVar8].ClearAllFn = WindowSettingsHandler_ClearAll;
    pIVar3[iVar8].ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    pIVar3[iVar8].ReadOpenFn = WindowSettingsHandler_ReadOpen;
    pIVar3[iVar8].ReadLineFn = WindowSettingsHandler_ReadLine;
    pIVar3[iVar8].ApplyAllFn = WindowSettingsHandler_ApplyAll;
    pIVar3[iVar8].WriteAllFn = WindowSettingsHandler_WriteAll;
    pIVar3[iVar8].UserData = (void *)0x0;
    (context->SettingsHandlers).Size = (context->SettingsHandlers).Size + 1;
    TableSettingsInstallHandler(context);
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pIVar6 = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0xb0,GImAllocatorUserData);
    auVar9 = ZEXT1632(ZEXT816(0) << 0x40);
    (pIVar6->super_ImGuiViewport).Flags = auVar9._0_4_;
    (pIVar6->super_ImGuiViewport).Pos.x = (float)(int)auVar9._4_8_;
    (pIVar6->super_ImGuiViewport).Pos.y = (float)(int)((ulong)auVar9._4_8_ >> 0x20);
    (pIVar6->super_ImGuiViewport).Size.x = (float)(int)auVar9._12_8_;
    (pIVar6->super_ImGuiViewport).Size.y = (float)(int)((ulong)auVar9._12_8_ >> 0x20);
    (pIVar6->super_ImGuiViewport).WorkPos.x = (float)(int)auVar9._20_8_;
    (pIVar6->super_ImGuiViewport).WorkPos.y = (float)(int)((ulong)auVar9._20_8_ >> 0x20);
    (pIVar6->super_ImGuiViewport).WorkSize.x = (float)auVar9._28_4_;
    (pIVar6->super_ImGuiViewport).WorkSize.y = 0.0;
    (pIVar6->DrawDataP).Valid = (bool)auVar9[0];
    *(int3 *)&(pIVar6->DrawDataP).field_0x1 = auVar9._1_3_;
    (pIVar6->DrawDataP).CmdListsCount = auVar9._4_4_;
    (pIVar6->DrawDataP).TotalIdxCount = auVar9._8_4_;
    (pIVar6->DrawDataP).TotalVtxCount = auVar9._12_4_;
    (pIVar6->DrawDataP).CmdLists = (ImDrawList **)auVar9._16_8_;
    (pIVar6->DrawDataP).DisplayPos.x = (float)(int)auVar9._24_8_;
    (pIVar6->DrawDataP).DisplayPos.y = (float)(int)((ulong)auVar9._24_8_ >> 0x20);
    auVar9 = ZEXT1632(ZEXT816(0) << 0x40);
    *(undefined1 (*) [32])&(pIVar6->DrawDataP).DisplaySize = auVar9;
    *(undefined1 (*) [32])((pIVar6->DrawDataBuilder).Layers + 1) = auVar9;
    (pIVar6->WorkOffsetMin).x = (float)(int)auVar9._0_8_;
    (pIVar6->WorkOffsetMin).y = (float)(int)((ulong)auVar9._0_8_ >> 0x20);
    (pIVar6->WorkOffsetMax).x = (float)(int)auVar9._8_8_;
    (pIVar6->WorkOffsetMax).y = (float)(int)((ulong)auVar9._8_8_ >> 0x20);
    (pIVar6->CurrWorkOffsetMin).x = (float)(int)auVar9._16_8_;
    (pIVar6->CurrWorkOffsetMin).y = (float)(int)((ulong)auVar9._16_8_ >> 0x20);
    (pIVar6->CurrWorkOffsetMax).x = (float)(int)auVar9._24_8_;
    (pIVar6->CurrWorkOffsetMax).y = (float)(int)((ulong)auVar9._24_8_ >> 0x20);
    pIVar6->DrawListsLastFrame[0] = -1;
    pIVar6->DrawListsLastFrame[1] = -1;
    *(undefined1 (*) [16])pIVar6->DrawLists = ZEXT416(0) << 0x40;
    iVar8 = (context->Viewports).Size;
    iVar2 = (context->Viewports).Capacity;
    if (iVar8 == iVar2) {
      iVar8 = iVar8 + 1;
      if (iVar2 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar2 / 2 + iVar2;
      }
      if (iVar8 < iVar7) {
        iVar8 = iVar7;
      }
      if (iVar2 < iVar8) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest_00 = (ImGuiViewportP **)
                    (*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData);
        ppIVar4 = (context->Viewports).Data;
        if (ppIVar4 != (ImGuiViewportP **)0x0) {
          memcpy(__dest_00,ppIVar4,(long)(context->Viewports).Size << 3);
          ppIVar4 = (context->Viewports).Data;
          if ((ppIVar4 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
        }
        (context->Viewports).Data = __dest_00;
        (context->Viewports).Capacity = iVar8;
      }
    }
    (context->Viewports).Data[(context->Viewports).Size] = pIVar6;
    (context->Viewports).Size = (context->Viewports).Size + 1;
    context->Initialized = true;
    return;
  }
  __assert_fail("!g.Initialized && !g.SettingsLoaded",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0xfe1,"void ImGui::Initialize(ImGuiContext *)");
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

#ifdef IMGUI_HAS_TABLE
    // Add .ini handle for ImGuiTable type
    TableSettingsInstallHandler(context);
#endif // #ifdef IMGUI_HAS_TABLE

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

    g.Initialized = true;
}